

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcg.c
# Opt level: O1

void liveness_pass_1(TCGContext_conflict9 *s)

{
  byte *pbVar1;
  byte bVar2;
  uint ng;
  uint nt;
  TCGOp *pTVar3;
  TCGOpDef *pTVar4;
  TCGRegSet *pTVar5;
  ulong uVar6;
  uint *puVar7;
  TCGArg TVar8;
  bool bVar9;
  uint uVar10;
  uint8_t *puVar11;
  ulong uVar12;
  long lVar13;
  void **ppvVar14;
  long lVar15;
  TCGArg TVar16;
  ulong uVar17;
  undefined2 uVar18;
  uint uVar19;
  TCGRegSet TVar20;
  uint uVar21;
  uint uVar22;
  uint uVar23;
  uint uVar24;
  TCGOp *op;
  ulong uVar25;
  
  ng = s->nb_globals;
  nt = s->nb_temps;
  uVar10 = nt * 4 + 7;
  uVar19 = nt * 4 + 0xe;
  if (-1 < (int)uVar10) {
    uVar19 = uVar10;
  }
  puVar11 = s->pool_cur;
  if (s->pool_end < puVar11 + (int)(uVar19 & 0xfffffff8)) {
    puVar11 = (uint8_t *)tcg_malloc_internal_tricore(s,uVar19 & 0xfffffff8);
  }
  else {
    s->pool_cur = puVar11 + (int)(uVar19 & 0xfffffff8);
  }
  if (0 < (int)nt) {
    lVar15 = 0;
    do {
      *(uint8_t **)((long)&s->temps[0].state_ptr + lVar15) = puVar11;
      puVar11 = puVar11 + 4;
      lVar15 = lVar15 + 0x38;
    } while ((ulong)nt * 0x38 - lVar15 != 0);
  }
  la_func_end(s,ng,nt);
  op = (TCGOp *)((s->ops).tqh_circ.tql_prev)->tql_prev->tql_next;
  if (op != (TCGOp *)0x0) {
    lVar15 = (ulong)ng * 0x38;
    do {
      pTVar3 = (TCGOp *)((op->link).tqe_circ.tql_prev)->tql_prev->tql_next;
      uVar19 = *(uint *)op;
      uVar10 = uVar19 & 0xff;
      uVar24 = uVar10 << 5;
      pTVar4 = s->tcg_op_defs;
      if (uVar10 < 0x7b) {
        if (0x27 < uVar10) {
          uVar21 = 0x13;
          if (uVar10 - 0x29 < 2) goto LAB_00d0e1d3;
          if (uVar10 == 0x28) {
            uVar21 = 0x12;
            goto LAB_00d0e210;
          }
switchD_00d0e1bd_caseD_7f:
          bVar2 = (&pTVar4->nb_oargs)[uVar24];
          uVar25 = (ulong)bVar2;
          uVar23 = (uint)(&pTVar4->nb_iargs)[uVar24];
          if (bVar2 != 0 && ((&pTVar4->flags)[uVar24] & 8) == 0) {
            uVar17 = 0;
            do {
              if (*(long *)(op->args[uVar17] + 0x28) != 1) goto LAB_00d0e273;
              uVar17 = uVar17 + 1;
            } while (bVar2 != uVar17);
            goto LAB_00d0e22d;
          }
          goto LAB_00d0e273;
        }
        if (uVar10 == 0) {
          TVar16 = op->args[0];
          *(undefined8 *)(TVar16 + 0x28) = 1;
          **(undefined4 **)(TVar16 + 0x30) = 0;
          goto switchD_00d0e1bd_caseD_81;
        }
        if (uVar10 != 2) {
          uVar21 = 0x11;
          if (uVar10 == 0x27) goto LAB_00d0e210;
          goto switchD_00d0e1bd_caseD_7f;
        }
        uVar10 = uVar19 >> 0xc & 0xf;
        uVar25 = (ulong)uVar10;
        uVar19 = uVar19 >> 8 & 0xf;
        TVar16 = op->args[(ulong)(uVar19 + uVar10) + 1];
        if ((TVar16 & 4) == 0) {
LAB_00d0e4a6:
          if (uVar10 == 0) {
            uVar24 = 0;
          }
          else {
            uVar17 = 0;
            uVar24 = 0;
            do {
              TVar8 = op->args[uVar17];
              uVar21 = 0;
              if ((*(ulong *)(TVar8 + 0x28) & 1) != 0) {
                uVar21 = 4 << ((byte)uVar17 & 0x1f);
              }
              uVar23 = 0;
              if ((*(ulong *)(TVar8 + 0x28) & 2) != 0) {
                uVar23 = 1 << ((byte)uVar17 & 0x1f);
              }
              uVar24 = uVar24 | uVar23 | uVar21;
              *(undefined8 *)(TVar8 + 0x28) = 1;
              **(undefined4 **)(TVar8 + 0x30) = 0;
              op->output_pref[uVar17] = 0;
              uVar17 = uVar17 + 1;
            } while (uVar25 != uVar17);
          }
          uVar18 = (undefined2)uVar24;
          if ((TVar16 & 3) == 0) {
            if (0 < (int)ng) {
              lVar13 = 0;
              do {
                *(undefined8 *)((long)&s->temps[0].state + lVar13) = 3;
                **(TCGRegSet **)((long)&s->temps[0].state_ptr + lVar13) =
                     s->tcg_target_available_regs[(byte)(&s->temps[0].field_0x3)[lVar13]];
                lVar13 = lVar13 + 0x38;
              } while (lVar15 != lVar13);
            }
          }
          else if ((TVar16 & 1) == 0) {
            la_global_sync(s,ng);
          }
          uVar17 = uVar25;
          if (uVar19 != 0) {
            do {
              if ((op->args[uVar17] != 0) && ((*(byte *)(op->args[uVar17] + 0x28) & 1) != 0)) {
                uVar24 = uVar24 | 4 << ((byte)uVar17 & 0x1f);
              }
              uVar18 = (undefined2)uVar24;
              uVar17 = uVar17 + 1;
            } while (uVar17 < uVar19 + uVar10);
          }
          la_cross_call(s,nt);
          bVar9 = true;
          if (uVar19 != 0) {
            uVar17 = 0;
            do {
              TVar16 = op->args[uVar25 + uVar17];
              if ((TVar16 != 0) && (uVar12 = *(ulong *)(TVar16 + 0x28), (uVar12 & 1) != 0)) {
                TVar20 = 0;
                if (5 < uVar17) {
                  TVar20 = s->tcg_target_available_regs[*(byte *)(TVar16 + 3)];
                }
                **(TCGRegSet **)(TVar16 + 0x30) = TVar20;
                *(ulong *)(TVar16 + 0x28) = uVar12 & 0xfffffffffffffffe;
              }
              uVar17 = uVar17 + 1;
            } while (uVar19 != uVar17);
            if (5 < uVar19) {
              uVar19 = 6;
            }
            uVar17 = 0;
            do {
              lVar13 = *(long *)((long)op->args + uVar17 * 2 + uVar25 * 8);
              if (lVar13 != 0) {
                puVar7 = *(uint **)(lVar13 + 0x30);
                *puVar7 = *puVar7 | 1 << (*(byte *)((long)tcg_target_call_iarg_regs + uVar17) & 0x1f
                                         );
              }
              uVar17 = uVar17 + 4;
            } while (uVar19 << 2 != uVar17);
          }
        }
        else {
          if (uVar10 != 0) {
            uVar17 = 0;
            do {
              if (*(long *)(op->args[uVar17] + 0x28) != 1) goto LAB_00d0e4a6;
              uVar17 = uVar17 + 1;
            } while (uVar25 != uVar17);
          }
          uVar18 = 0;
          bVar9 = false;
        }
        if (bVar9) goto LAB_00d0e53b;
LAB_00d0e22f:
        tcg_op_remove_tricore(s,op);
      }
      else {
        switch(uVar10) {
        case 0x7b:
          uVar21 = 0x4e;
          break;
        case 0x7c:
          uVar21 = 0x4f;
          break;
        case 0x7d:
        case 0x7e:
          uVar21 = 0x50;
LAB_00d0e1d3:
          uVar25 = 2;
          uVar23 = 2;
          if (*(long *)(op->args[1] + 0x28) != 1) goto LAB_00d0e273;
          TVar16 = op->args[0];
          lVar13 = 0x30;
          goto LAB_00d0e226;
        default:
          goto switchD_00d0e1bd_caseD_7f;
        case 0x81:
switchD_00d0e1bd_caseD_81:
          uVar18 = 0;
          goto LAB_00d0e53b;
        }
LAB_00d0e210:
        if (*(long *)(op->args[1] + 0x28) == 1) {
          TVar16 = op->args[0];
          lVar13 = 0x38;
LAB_00d0e226:
          if (*(long *)(TVar16 + 0x28) == 1) {
LAB_00d0e22d:
            uVar18 = 0;
            goto LAB_00d0e22f;
          }
          *(uint *)op = uVar19 & 0xffffff00 | uVar21;
          op->args[1] = op->args[2];
          op->args[2] = *(TCGArg *)((long)op->args + lVar13 + -0x18);
          uVar23 = 2;
          uVar25 = 1;
          uVar10 = uVar21;
        }
        else {
          uVar23 = 4;
          uVar25 = 2;
        }
LAB_00d0e273:
        if ((char)uVar25 == '\0') {
          uVar19 = 0;
        }
        else {
          uVar17 = 0;
          uVar19 = 0;
          do {
            TVar16 = op->args[uVar17];
            pTVar5 = *(TCGRegSet **)(TVar16 + 0x30);
            op->output_pref[uVar17] = *pTVar5;
            uVar21 = 4 << ((byte)uVar17 & 0x1f);
            if ((*(ulong *)(TVar16 + 0x28) & 1) == 0) {
              uVar21 = 0;
            }
            uVar22 = 1 << ((byte)uVar17 & 0x1f);
            if ((*(ulong *)(TVar16 + 0x28) & 2) == 0) {
              uVar22 = 0;
            }
            uVar19 = uVar19 | uVar22 | uVar21;
            *(undefined8 *)(TVar16 + 0x28) = 1;
            *pTVar5 = 0;
            uVar17 = uVar17 + 1;
          } while (uVar25 != uVar17);
        }
        bVar2 = (&pTVar4->flags)[uVar24];
        if ((bVar2 & 1) == 0) {
          if ((bVar2 & 2) == 0) {
            if (((bVar2 & 8) != 0) && (la_global_sync(s,ng), ((&pTVar4->flags)[uVar24] & 4) != 0)) {
              la_cross_call(s,nt);
            }
          }
          else if (uVar10 == 0x26) {
            if (0 < (int)ng) {
              lVar13 = 0;
              do {
                pbVar1 = (byte *)((long)&s->temps[0].state + lVar13);
                *pbVar1 = *pbVar1 | 2;
                lVar13 = lVar13 + 0x38;
              } while (lVar15 != lVar13);
            }
          }
          else {
            if (0 < (int)ng) {
              lVar13 = 0;
              do {
                *(undefined8 *)((long)&s->temps[0].state + lVar13) = 3;
                **(TCGRegSet **)((long)&s->temps[0].state_ptr + lVar13) =
                     s->tcg_target_available_regs[(byte)(&s->temps[0].field_0x3)[lVar13]];
                lVar13 = lVar13 + 0x38;
              } while (lVar15 != lVar13);
            }
            ppvVar14 = &s->temps[(int)ng].state_ptr;
            lVar13 = (long)(int)nt - (long)(int)ng;
            if ((int)ng < (int)nt) {
              do {
                uVar17 = *(ulong *)(ppvVar14 + -6) & 0x4000000000;
                TVar20 = 0;
                ppvVar14[-1] = (void *)((uVar17 >> 0x26) * 2 + 1);
                if (uVar17 != 0) {
                  TVar20 = s->tcg_target_available_regs[*(ulong *)(ppvVar14 + -6) >> 0x18 & 0xff];
                }
                *(TCGRegSet *)*ppvVar14 = TVar20;
                ppvVar14 = ppvVar14 + 7;
                lVar13 = lVar13 + -1;
              } while (lVar13 != 0);
            }
          }
        }
        else {
          la_func_end(s,ng,nt);
        }
        uVar12 = (ulong)((int)uVar25 + uVar23);
        uVar17 = uVar25;
        if (uVar23 != 0) {
          do {
            uVar21 = 0;
            if ((*(byte *)(op->args[uVar17] + 0x28) & 1) != 0) {
              uVar21 = 4 << ((byte)uVar17 & 0x1f);
            }
            uVar19 = uVar19 | uVar21;
            uVar17 = uVar17 + 1;
          } while (uVar17 < uVar12);
        }
        uVar18 = (undefined2)uVar19;
        uVar17 = uVar25;
        if (uVar23 != 0) {
          do {
            TVar16 = op->args[uVar17];
            uVar6 = *(ulong *)(TVar16 + 0x28);
            if ((uVar6 & 1) != 0) {
              **(TCGRegSet **)(TVar16 + 0x30) = s->tcg_target_available_regs[*(byte *)(TVar16 + 3)];
              *(ulong *)(TVar16 + 0x28) = uVar6 & 0xfffffffffffffffe;
            }
            uVar17 = uVar17 + 1;
          } while (uVar17 < uVar12);
        }
        if ((uVar10 == 5) || (uVar10 == 0x3f)) {
          if ((uVar19 & 8) != 0) {
            **(undefined4 **)(op->args[0] + 0x30) = **(undefined4 **)(op->args[1] + 0x30);
          }
        }
        else if (uVar23 != 0) {
          lVar13 = *(long *)((long)&pTVar4->args_ct + (ulong)uVar24);
          do {
            puVar7 = *(uint **)(op->args[uVar25] + 0x30);
            uVar19 = *(uint *)(lVar13 + 4 + uVar25 * 8);
            uVar10 = *puVar7 & uVar19;
            if ((*(byte *)(lVar13 + uVar25 * 8) & 0x40) != 0) {
              uVar10 = uVar10 & op->output_pref[*(byte *)(lVar13 + 2 + uVar25 * 8)];
            }
            if (uVar10 != 0) {
              uVar19 = uVar10;
            }
            *puVar7 = uVar19;
            uVar25 = uVar25 + 1;
          } while (uVar25 < uVar12);
        }
      }
LAB_00d0e53b:
      *(undefined2 *)&op->field_0x2 = uVar18;
      op = pTVar3;
    } while (pTVar3 != (TCGOp *)0x0);
  }
  return;
}

Assistant:

static void liveness_pass_1(TCGContext *s)
{
    int nb_globals = s->nb_globals;
    int nb_temps = s->nb_temps;
    TCGOp *op, *op_prev;
    TCGRegSet *prefs;
    int i;

    prefs = tcg_malloc(s, sizeof(TCGRegSet) * nb_temps);
    for (i = 0; i < nb_temps; ++i) {
        s->temps[i].state_ptr = prefs + i;
    }

    /* ??? Should be redundant with the exit_tb that ends the TB.  */
    la_func_end(s, nb_globals, nb_temps);

    QTAILQ_FOREACH_REVERSE_SAFE(op, &s->ops, link, op_prev) {
        int nb_iargs, nb_oargs;
        TCGOpcode opc_new, opc_new2;
        bool have_opc_new2;
        TCGLifeData arg_life = 0;
        TCGTemp *ts;
        TCGOpcode opc = op->opc;
        const TCGOpDef *def = &s->tcg_op_defs[opc];

        switch (opc) {
        case INDEX_op_call:
            {
                int call_flags;
                int nb_call_regs;

                nb_oargs = TCGOP_CALLO(op);
                nb_iargs = TCGOP_CALLI(op);
                call_flags = op->args[nb_oargs + nb_iargs + 1];

                /* pure functions can be removed if their result is unused */
                if (call_flags & TCG_CALL_NO_SIDE_EFFECTS) {
                    for (i = 0; i < nb_oargs; i++) {
                        ts = arg_temp(op->args[i]);
                        if (ts->state != TS_DEAD) {
                            goto do_not_remove_call;
                        }
                    }
                    goto do_remove;
                }
            do_not_remove_call:

                /* Output args are dead.  */
                for (i = 0; i < nb_oargs; i++) {
                    ts = arg_temp(op->args[i]);
                    if (ts->state & TS_DEAD) {
                        arg_life |= DEAD_ARG << i;
                    }
                    if (ts->state & TS_MEM) {
                        arg_life |= SYNC_ARG << i;
                    }
                    ts->state = TS_DEAD;
                    la_reset_pref(s, ts);

                    /* Not used -- it will be tcg_target_call_oarg_regs[i].  */
                    op->output_pref[i] = 0;
                }

                if (!(call_flags & (TCG_CALL_NO_WRITE_GLOBALS |
                                    TCG_CALL_NO_READ_GLOBALS))) {
                    la_global_kill(s, nb_globals);
                } else if (!(call_flags & TCG_CALL_NO_READ_GLOBALS)) {
                    la_global_sync(s, nb_globals);
                }

                /* Record arguments that die in this helper.  */
                for (i = nb_oargs; i < nb_iargs + nb_oargs; i++) {
                    ts = arg_temp(op->args[i]);
                    if (ts && ts->state & TS_DEAD) {
                        arg_life |= DEAD_ARG << i;
                    }
                }

                /* For all live registers, remove call-clobbered prefs.  */
                la_cross_call(s, nb_temps);

                nb_call_regs = ARRAY_SIZE(tcg_target_call_iarg_regs);

                /* Input arguments are live for preceding opcodes.  */
                for (i = 0; i < nb_iargs; i++) {
                    ts = arg_temp(op->args[i + nb_oargs]);
                    if (ts && ts->state & TS_DEAD) {
                        /* For those arguments that die, and will be allocated
                         * in registers, clear the register set for that arg,
                         * to be filled in below.  For args that will be on
                         * the stack, reset to any available reg.
                         */
                        *la_temp_pref(ts)
                            = (i < nb_call_regs ? 0 :
                               s->tcg_target_available_regs[ts->type]);
                        ts->state &= ~TS_DEAD;
                    }
                }

                /* For each input argument, add its input register to prefs.
                   If a temp is used once, this produces a single set bit.  */
                for (i = 0; i < MIN(nb_call_regs, nb_iargs); i++) {
                    ts = arg_temp(op->args[i + nb_oargs]);
                    if (ts) {
                        tcg_regset_set_reg(*la_temp_pref(ts),
                                           tcg_target_call_iarg_regs[i]);
                    }
                }
            }
            break;
        case INDEX_op_insn_start:
            break;
        case INDEX_op_discard:
            /* mark the temporary as dead */
            ts = arg_temp(op->args[0]);
            ts->state = TS_DEAD;
            la_reset_pref(s, ts);
            break;

        case INDEX_op_add2_i32:
            opc_new = INDEX_op_add_i32;
            goto do_addsub2;
        case INDEX_op_sub2_i32:
            opc_new = INDEX_op_sub_i32;
            goto do_addsub2;
        case INDEX_op_add2_i64:
            opc_new = INDEX_op_add_i64;
            goto do_addsub2;
        case INDEX_op_sub2_i64:
            opc_new = INDEX_op_sub_i64;
        do_addsub2:
            nb_iargs = 4;
            nb_oargs = 2;
            /* Test if the high part of the operation is dead, but not
               the low part.  The result can be optimized to a simple
               add or sub.  This happens often for x86_64 guest when the
               cpu mode is set to 32 bit.  */
            if (arg_temp(op->args[1])->state == TS_DEAD) {
                if (arg_temp(op->args[0])->state == TS_DEAD) {
                    goto do_remove;
                }
                /* Replace the opcode and adjust the args in place,
                   leaving 3 unused args at the end.  */
                op->opc = opc = opc_new;
                op->args[1] = op->args[2];
                op->args[2] = op->args[4];
                /* Fall through and mark the single-word operation live.  */
                nb_iargs = 2;
                nb_oargs = 1;
            }
            goto do_not_remove;

        case INDEX_op_mulu2_i32:
            opc_new = INDEX_op_mul_i32;
            opc_new2 = INDEX_op_muluh_i32;
            have_opc_new2 = TCG_TARGET_HAS_muluh_i32;
            goto do_mul2;
        case INDEX_op_muls2_i32:
            opc_new = INDEX_op_mul_i32;
            opc_new2 = INDEX_op_mulsh_i32;
            have_opc_new2 = TCG_TARGET_HAS_mulsh_i32;
            goto do_mul2;
        case INDEX_op_mulu2_i64:
            opc_new = INDEX_op_mul_i64;
            opc_new2 = INDEX_op_muluh_i64;
            have_opc_new2 = TCG_TARGET_HAS_muluh_i64;
            goto do_mul2;
        case INDEX_op_muls2_i64:
            opc_new = INDEX_op_mul_i64;
            opc_new2 = INDEX_op_mulsh_i64;
            have_opc_new2 = TCG_TARGET_HAS_mulsh_i64;
            goto do_mul2;
        do_mul2:
            nb_iargs = 2;
            nb_oargs = 2;
            if (arg_temp(op->args[1])->state == TS_DEAD) {
                if (arg_temp(op->args[0])->state == TS_DEAD) {
                    /* Both parts of the operation are dead.  */
                    goto do_remove;
                }
                /* The high part of the operation is dead; generate the low. */
                op->opc = opc = opc_new;
                op->args[1] = op->args[2];
                op->args[2] = op->args[3];
            } else if (arg_temp(op->args[0])->state == TS_DEAD && have_opc_new2) {
                /* The low part of the operation is dead; generate the high. */
                op->opc = opc = opc_new2;
                op->args[0] = op->args[1];
                op->args[1] = op->args[2];
                op->args[2] = op->args[3];
            } else {
                goto do_not_remove;
            }
            /* Mark the single-word operation live.  */
            nb_oargs = 1;
            goto do_not_remove;

        default:
            /* XXX: optimize by hardcoding common cases (e.g. triadic ops) */
            nb_iargs = def->nb_iargs;
            nb_oargs = def->nb_oargs;

            /* Test if the operation can be removed because all
               its outputs are dead. We assume that nb_oargs == 0
               implies side effects */
            if (!(def->flags & TCG_OPF_SIDE_EFFECTS) && nb_oargs != 0) {
                for (i = 0; i < nb_oargs; i++) {
                    if (arg_temp(op->args[i])->state != TS_DEAD) {
                        goto do_not_remove;
                    }
                }
                goto do_remove;
            }
            goto do_not_remove;

        do_remove:
            tcg_op_remove(s, op);
            break;

        do_not_remove:
            for (i = 0; i < nb_oargs; i++) {
                ts = arg_temp(op->args[i]);

                /* Remember the preference of the uses that followed.  */
                op->output_pref[i] = *la_temp_pref(ts);

                /* Output args are dead.  */
                if (ts->state & TS_DEAD) {
                    arg_life |= DEAD_ARG << i;
                }
                if (ts->state & TS_MEM) {
                    arg_life |= SYNC_ARG << i;
                }
                ts->state = TS_DEAD;
                la_reset_pref(s, ts);
            }

            /* If end of basic block, update.  */
            if (def->flags & TCG_OPF_BB_EXIT) {
                la_func_end(s, nb_globals, nb_temps);
            } else if (def->flags & TCG_OPF_BB_END) {
                // Unicorn: do not optimize dead temps on brcond,
                // this causes problem because check_exit_request() inserts
                // brcond instruction in the middle of the TB,
                // which incorrectly flags end-of-block
                if (opc != INDEX_op_brcond_i32) {
                    la_bb_end(s, nb_globals, nb_temps);
                } else {
                    // Unicorn: we do not touch dead temps for brcond,
                    // but we should refresh TCG globals In-Memory states,
                    // otherwise, important CPU states(especially conditional flags) might be forgotten,
                    // result in wrongly generated host code that run into wrong branch.
                    // Refer to https://github.com/unicorn-engine/unicorn/issues/287 for further information
                    la_brcond_end(s, nb_globals);
                }
            } else if (def->flags & TCG_OPF_SIDE_EFFECTS) {
                la_global_sync(s, nb_globals);
                if (def->flags & TCG_OPF_CALL_CLOBBER) {
                    la_cross_call(s, nb_temps);
                }
            }

            /* Record arguments that die in this opcode.  */
            for (i = nb_oargs; i < nb_oargs + nb_iargs; i++) {
                ts = arg_temp(op->args[i]);
                if (ts->state & TS_DEAD) {
                    arg_life |= DEAD_ARG << i;
                }
            }

            /* Input arguments are live for preceding opcodes.  */
            for (i = nb_oargs; i < nb_oargs + nb_iargs; i++) {
                ts = arg_temp(op->args[i]);
                if (ts->state & TS_DEAD) {
                    /* For operands that were dead, initially allow
                       all regs for the type.  */
                    *la_temp_pref(ts) = s->tcg_target_available_regs[ts->type];
                    ts->state &= ~TS_DEAD;
                }
            }

            /* Incorporate constraints for this operand.  */
            switch (opc) {
            case INDEX_op_mov_i32:
            case INDEX_op_mov_i64:
                /* Note that these are TCG_OPF_NOT_PRESENT and do not
                   have proper constraints.  That said, special case
                   moves to propagate preferences backward.  */
                if (IS_DEAD_ARG(1)) {
                    *la_temp_pref(arg_temp(op->args[0]))
                        = *la_temp_pref(arg_temp(op->args[1]));
                }
                break;

            default:
                for (i = nb_oargs; i < nb_oargs + nb_iargs; i++) {
                    const TCGArgConstraint *ct = &def->args_ct[i];
                    TCGRegSet set, *pset;

                    ts = arg_temp(op->args[i]);
                    pset = la_temp_pref(ts);
                    set = *pset;

                    set &= ct->u.regs;
                    if (ct->ct & TCG_CT_IALIAS) {
                        set &= op->output_pref[ct->alias_index];
                    }
                    /* If the combination is not possible, restart.  */
                    if (set == 0) {
                        set = ct->u.regs;
                    }
                    *pset = set;
                }
                break;
            }
            break;
        }
        op->life = arg_life;
    }
}